

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * passphrase_callback(archive *a,void *_client_data)

{
  void *pvVar1;
  char *pcVar2;
  int *piVar3;
  
  if (*(long *)((long)_client_data + 0x120) == 0) {
    pvVar1 = malloc(0x400);
    *(void **)((long)_client_data + 0x120) = pvVar1;
    if (pvVar1 == (void *)0x0) {
      piVar3 = __errno_location();
      lafe_errc(1,*piVar3,"Out of memory");
    }
  }
  pcVar2 = lafe_readpassphrase("Enter passphrase:",*(char **)((long)_client_data + 0x120),0x400);
  return pcVar2;
}

Assistant:

const char *
passphrase_callback(struct archive *a, void *_client_data)
{
	struct bsdtar *bsdtar = (struct bsdtar *)_client_data;
	(void)a; /* UNUSED */

	if (bsdtar->ppbuff == NULL) {
		bsdtar->ppbuff = malloc(PPBUFF_SIZE);
		if (bsdtar->ppbuff == NULL)
			lafe_errc(1, errno, "Out of memory");
	}
	return lafe_readpassphrase("Enter passphrase:",
		bsdtar->ppbuff, PPBUFF_SIZE);
}